

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopPolicyBarrier(cmMakefile *this,bool reportError)

{
  reference pvVar1;
  size_type sVar2;
  allocator local_41;
  string local_40;
  value_type local_20;
  size_type barrier;
  cmMakefile *pcStack_10;
  bool reportError_local;
  cmMakefile *this_local;
  
  barrier._7_1_ = reportError;
  pcStack_10 = this;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->PolicyBarriers);
  local_20 = *pvVar1;
  while( true ) {
    sVar2 = std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
            ::size(&this->PolicyStack);
    if (sVar2 <= local_20) break;
    if ((barrier._7_1_ & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_40,"cmake_policy PUSH without matching POP",&local_41);
      IssueMessage(this,FATAL_ERROR,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      barrier._7_1_ = 0;
    }
    PopPolicy(this);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->PolicyBarriers);
  return;
}

Assistant:

void cmMakefile::PopPolicyBarrier(bool reportError)
{
  // Remove any extra entries pushed on the barrier.
  PolicyStackType::size_type barrier = this->PolicyBarriers.back();
  while(this->PolicyStack.size() > barrier)
    {
    if(reportError)
      {
      this->IssueMessage(cmake::FATAL_ERROR,
                         "cmake_policy PUSH without matching POP");
      reportError = false;
      }
    this->PopPolicy();
    }

  // Remove the barrier.
  this->PolicyBarriers.pop_back();
}